

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

string * __thiscall
cmLocalGenerator::CreateUtilityOutput
          (string *__return_storage_ptr__,cmLocalGenerator *this,string *targetName,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *param_2,cmListFileBacktrace *param_3)

{
  string *psVar1;
  cmSourceFile *this_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  long *local_88 [2];
  long local_78 [2];
  undefined1 local_68 [16];
  cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> local_58;
  undefined8 local_28;
  
  cmStateSnapshot::GetDirectory
            ((cmStateDirectory *)local_68,&(this->super_cmOutputConverter).StateSnapshot);
  psVar1 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)local_68);
  local_68._8_8_ = (psVar1->_M_dataplus)._M_p;
  local_68._0_8_ = psVar1->_M_string_length;
  local_58.Data.
  super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.Data.
  super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xc;
  local_58.Data.
  super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x81144e;
  local_58.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)(targetName->_M_dataplus)._M_p;
  local_58.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)targetName->_M_string_length;
  local_28 = 0;
  views._M_len = 3;
  views._M_array = (iterator)local_68;
  cmCatViews(__return_storage_ptr__,views);
  this_00 = cmMakefile::GetOrCreateGeneratedSource(this->Makefile,__return_storage_ptr__);
  if (this_00 == (cmSourceFile *)0x0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                   "Could not get source file entry for ",__return_storage_ptr__);
    cmSystemTools::Error((string *)local_68);
    if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_68._0_8_ == &local_58) {
      return __return_storage_ptr__;
    }
  }
  else {
    local_68._0_8_ = &local_58;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"SYMBOLIC","");
    local_88[0] = local_78;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"1","");
    cmSourceFile::SetProperty(this_00,(string *)local_68,(string *)local_88);
    if (local_88[0] != local_78) {
      operator_delete(local_88[0],local_78[0] + 1);
    }
    if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_68._0_8_ == &local_58) {
      return __return_storage_ptr__;
    }
  }
  operator_delete((void *)local_68._0_8_,
                  (ulong)((long)local_58.Data.
                                super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                                ._M_impl.super__Vector_impl_data._M_start + 1));
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalGenerator::CreateUtilityOutput(
  std::string const& targetName, std::vector<std::string> const&,
  cmListFileBacktrace const&)
{
  std::string force =
    cmStrCat(this->GetCurrentBinaryDirectory(), "/CMakeFiles/", targetName);
  // The output is not actually created so mark it symbolic.
  if (cmSourceFile* sf = this->Makefile->GetOrCreateGeneratedSource(force)) {
    sf->SetProperty("SYMBOLIC", "1");
  } else {
    cmSystemTools::Error("Could not get source file entry for " + force);
  }
  return force;
}